

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_ech_select_hello(ptls_t *tls,ptls_iovec_t message,size_t confirm_hash_off,char *label)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ptls_log_conn_state_t *conn;
  uint8_t *puVar4;
  int local_5c;
  int ptlslog_include_appdata;
  ptls_log_conn_state_t *conn_state;
  ptls_t *_tls;
  uint32_t active;
  int ret;
  uint8_t confirm_hash_expected [8];
  uint8_t confirm_hash_delivered [8];
  char *label_local;
  size_t confirm_hash_off_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  puVar4 = message.base;
  _tls._4_4_ = 0;
  if (confirm_hash_off != 0) {
    confirm_hash_expected = *(uint8_t (*) [8])(puVar4 + confirm_hash_off);
    memset(puVar4 + confirm_hash_off,0,8);
    _tls._4_4_ = ech_calc_confirmation
                           (tls->key_schedule,&active,(tls->ech).inner_client_random,label,message);
    if (_tls._4_4_ != 0) goto LAB_0013bce1;
    iVar1 = (*ptls_mem_equal)(confirm_hash_expected,&active,8);
    *(byte *)&tls->ech = *(byte *)&tls->ech & 0xfb | ((byte)iVar1 & 1) << 2;
    *(uint8_t (*) [8])(puVar4 + confirm_hash_off) = confirm_hash_expected;
    if ((*(byte *)&tls->ech >> 2 & 1) != 0) goto LAB_0013bce1;
  }
  ptls_aead_free((tls->ech).aead);
  (tls->ech).aead = (ptls_aead_context_t *)0x0;
  key_schedule_select_outer(tls->key_schedule);
LAB_0013bce1:
  uVar2 = ptls_log_point_maybe_active(&client_ech_select_hello::logpoint);
  if (uVar2 != 0) {
    conn = ptls_get_log_state(tls);
    uVar3 = ptls_log_conn_maybe_active(conn,ptls_get_server_name,tls);
    if ((uVar3 & uVar2) != 0) {
      local_5c = 0;
      do {
        ptls_log__do_write_start(&client_ech_select_hello::logpoint,1);
        ptls_log__do_push_element_unsigned64(",\"tls\":",7,(uint64_t)tls);
        ptls_log__do_push_element_bool(",\"is_ech\":",10,(uint)(*(byte *)&tls->ech >> 2 & 1));
        local_5c = ptls_log__do_write_end
                             (&client_ech_select_hello::logpoint,conn,ptls_get_server_name,tls,
                              local_5c);
      } while (local_5c != 0);
    }
  }
  (*ptls_clear_memory)(&active,8);
  return _tls._4_4_;
}

Assistant:

static int client_ech_select_hello(ptls_t *tls, ptls_iovec_t message, size_t confirm_hash_off, const char *label)
{
    uint8_t confirm_hash_delivered[PTLS_ECH_CONFIRM_LENGTH], confirm_hash_expected[PTLS_ECH_CONFIRM_LENGTH];
    int ret = 0;

    /* Determine if ECH has been accepted by checking the confirmation hash. `confirm_hash_off` set to zero indicates that HRR was
     * received wo. ECH extension, which is an indication that ECH was rejected. */
    if (confirm_hash_off != 0) {
        memcpy(confirm_hash_delivered, message.base + confirm_hash_off, sizeof(confirm_hash_delivered));
        memset(message.base + confirm_hash_off, 0, sizeof(confirm_hash_delivered));
        if ((ret = ech_calc_confirmation(tls->key_schedule, confirm_hash_expected, tls->ech.inner_client_random, label, message)) !=
            0)
            goto Exit;
        tls->ech.accepted = ptls_mem_equal(confirm_hash_delivered, confirm_hash_expected, sizeof(confirm_hash_delivered));
        memcpy(message.base + confirm_hash_off, confirm_hash_delivered, sizeof(confirm_hash_delivered));
        if (tls->ech.accepted)
            goto Exit;
    }

    /* dispose ECH AEAD state to indicate rejection, adopting outer CH for the rest of the handshake */
    ptls_aead_free(tls->ech.aead);
    tls->ech.aead = NULL;
    key_schedule_select_outer(tls->key_schedule);

Exit:
    PTLS_PROBE(ECH_SELECTION, tls, !!tls->ech.accepted);
    PTLS_LOG_CONN(ech_selection, tls, { PTLS_LOG_ELEMENT_BOOL(is_ech, tls->ech.accepted); });
    ptls_clear_memory(confirm_hash_expected, sizeof(confirm_hash_expected));
    return ret;
}